

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O2

bool __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<long>::TryGetPrecomputedValue
          (PrecomputeVisitor<long> *this,shared_ptr<const_calc4::Operator> *op,long *dest)

{
  shared_ptr<const_calc4::PrecomputedOperator> precomputed;
  shared_ptr<const_calc4::Operator> local_20;
  
  std::dynamic_pointer_cast<calc4::PrecomputedOperator_const,calc4::Operator_const>(&local_20);
  if (local_20.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (op->super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)
         local_20.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3].
         _vptr_Operator[1];
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return local_20.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0;
}

Assistant:

bool TryGetPrecomputedValue(const std::shared_ptr<const Operator>& op, TNumber* dest)
    {
        if (auto precomputed = std::dynamic_pointer_cast<const PrecomputedOperator>(op))
        {
            *dest = precomputed->GetValue<TNumber>();
            return true;
        }
        else
        {
            return false;
        }
    }